

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrdp.cpp
# Opt level: O2

void __thiscall pg::RRDPSolver::run(RRDPSolver *this)

{
  uint uVar1;
  bitset *pbVar2;
  vector<int,_std::allocator<int>_> *pvVar3;
  pointer piVar4;
  undefined1 auVar5 [16];
  int iVar6;
  uint *puVar7;
  bool bVar8;
  int iVar9;
  uint uVar10;
  ulong uVar11;
  ulong *puVar12;
  int *piVar13;
  int *piVar14;
  int *piVar15;
  int *piVar16;
  long lVar17;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __first;
  ostream *poVar18;
  int i;
  int iVar19;
  ulong uVar20;
  ulong uVar21;
  uint *puVar22;
  uint uVar23;
  Game *pGVar24;
  pointer piVar25;
  ulong uVar26;
  int p;
  int res;
  ulong local_78;
  int *local_70;
  ulong local_68;
  int local_5c;
  vector<int,_std::allocator<int>_> P;
  _label_vertex local_40;
  
  pGVar24 = (this->super_RRSolver).super_PPSolver.super_Solver.game;
  uVar20 = pGVar24->n_vertices;
  local_70 = pGVar24->_priority;
  uVar23 = *(uint *)((long)local_70 + ((long)((uVar20 << 0x20) + -0x100000000) >> 0x1e));
  uVar21 = (ulong)(int)(uVar23 + 1);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = uVar21;
  uVar11 = SUB168(auVar5 * ZEXT816(0x18),0);
  uVar26 = uVar11 + 8;
  if (0xfffffffffffffff7 < uVar11) {
    uVar26 = 0xffffffffffffffff;
  }
  (this->super_RRSolver).super_PPSolver.max_prio = uVar23;
  if (SUB168(auVar5 * ZEXT816(0x18),8) != 0) {
    uVar26 = 0xffffffffffffffff;
  }
  puVar12 = (ulong *)operator_new__(uVar26);
  *puVar12 = uVar21;
  local_78 = uVar21;
  local_68 = (ulong)uVar23;
  if (uVar23 != 0xffffffff) {
    memset((vector<int,_std::allocator<int>_> *)(puVar12 + 1),0,
           ((uVar11 - 0x18) - (uVar11 - 0x18) % 0x18) + 0x18);
  }
  (this->super_RRSolver).super_PPSolver.regions = (vector<int,_std::allocator<int>_> *)(puVar12 + 1)
  ;
  uVar26 = -(ulong)(uVar20 >> 0x3e != 0) | uVar20 * 4;
  piVar13 = (int *)operator_new__(uVar26);
  (this->super_RRSolver).super_PPSolver.region = piVar13;
  piVar14 = (int *)operator_new__(uVar26);
  this->region_ = piVar14;
  piVar15 = (int *)operator_new__(uVar26);
  (this->super_RRSolver).super_PPSolver.strategy = piVar15;
  uVar26 = local_78 << 2;
  if ((int)local_68 < -1) {
    uVar26 = 0xffffffffffffffff;
  }
  piVar16 = (int *)operator_new__(uVar26);
  (this->super_RRSolver).super_PPSolver.inverse = piVar16;
  pbVar2 = (this->super_RRSolver).super_PPSolver.super_Solver.disabled;
  uVar26 = ~((long)uVar20 >> 0x3f) & uVar20;
  for (uVar11 = 0; uVar26 != uVar11; uVar11 = uVar11 + 1) {
    iVar19 = -2;
    if ((pbVar2->_bits[uVar11 >> 6] >> (uVar11 & 0x3f) & 1) == 0) {
      iVar19 = local_70[uVar11];
    }
    piVar13[uVar11] = iVar19;
  }
  for (uVar11 = 0; uVar26 != uVar11; uVar11 = uVar11 + 1) {
    piVar14[uVar11] = -1;
  }
  for (uVar11 = 0; uVar26 != uVar11; uVar11 = uVar11 + 1) {
    piVar15[uVar11] = -1;
  }
  (this->super_RRSolver).super_PPSolver.promotions = 0;
  uVar23 = (int)uVar20 - 1;
  local_68 = 0;
  local_70 = (int *)((ulong)local_70 & 0xffffffff00000000);
  local_78 = local_78 & 0xffffffff00000000;
  local_5c = 0;
  P.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_end_of_storage
       = (pointer)0x0;
  P.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  P.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
LAB_0014bd93:
  uVar20 = local_68;
  p = 0xffffffff;
  if (-1 < (int)uVar23) {
    p = pGVar24->_priority[uVar23];
  }
  piVar13 = (this->super_RRSolver).super_PPSolver.region;
  for (; -1 < (int)uVar23; uVar23 = uVar23 - 1) {
    piVar14 = pGVar24->_priority;
    uVar26 = (ulong)uVar23;
    if (piVar14[uVar26] != p) {
      pvVar3 = (this->super_RRSolver).super_PPSolver.regions;
      uVar1 = uVar23;
      if (pvVar3[p].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start !=
          pvVar3[p].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish) {
        PPSolver::resetRegion((PPSolver *)this,p);
      }
      goto LAB_0014c31e;
    }
    if (((((this->super_RRSolver).super_PPSolver.super_Solver.disabled)->_bits[uVar23 >> 6] >>
          (uVar26 & 0x3f) & 1) == 0) && (piVar13[uVar26] <= p)) {
      (this->super_RRSolver).super_PPSolver.inverse[p] = uVar23;
      iVar19 = piVar14[uVar26];
      iVar9 = (*(this->super_RRSolver).super_PPSolver.super_Solver._vptr_Solver[5])
                        (this,(ulong)(uint)p);
      bVar8 = PPSolver::setupRegion((PPSolver *)this,uVar23,iVar19,(bool)((byte)iVar9 ^ 1));
      if (bVar8) {
        uVar20 = (ulong)(uint)p;
        goto LAB_0014bf90;
      }
      goto LAB_0014c0ed;
    }
  }
  uVar23 = 0xffffffff;
  for (uVar26 = 0; (~(pGVar24->n_vertices >> 0x3f) & pGVar24->n_vertices) != uVar26;
      uVar26 = uVar26 + 1) {
    if ((int)uVar23 <= this->region_[uVar26]) {
      uVar23 = this->region_[uVar26];
    }
  }
  if (uVar23 == 0xffffffff) {
    pvVar3 = (this->super_RRSolver).super_PPSolver.regions;
    if (pvVar3 != (vector<int,_std::allocator<int>_> *)0x0) {
      piVar25 = pvVar3[-1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
      if (piVar25 != (pointer)0x0) {
        lVar17 = (long)piVar25 * 0x18;
        do {
          std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                    ((_Vector_base<int,_std::allocator<int>_> *)
                     ((long)&pvVar3[-1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start + lVar17));
          lVar17 = lVar17 + -0x18;
        } while (lVar17 != 0);
      }
      operator_delete__(&pvVar3[-1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage,(long)piVar25 * 0x18 + 8);
      piVar13 = (this->super_RRSolver).super_PPSolver.region;
    }
    if (piVar13 != (int *)0x0) {
      operator_delete__(piVar13);
    }
    if (this->region_ != (int *)0x0) {
      operator_delete__(this->region_);
    }
    piVar13 = (this->super_RRSolver).super_PPSolver.strategy;
    if (piVar13 != (int *)0x0) {
      operator_delete__(piVar13);
    }
    piVar13 = (this->super_RRSolver).super_PPSolver.inverse;
    if (piVar13 != (int *)0x0) {
      operator_delete__(piVar13);
    }
    poVar18 = std::operator<<((this->super_RRSolver).super_PPSolver.super_Solver.logger,
                              "solved with ");
    poVar18 = (ostream *)
              std::ostream::operator<<(poVar18,(this->super_RRSolver).super_PPSolver.promotions);
    poVar18 = std::operator<<(poVar18," promotions, ");
    poVar18 = (ostream *)std::ostream::operator<<(poVar18,local_5c);
    poVar18 = std::operator<<(poVar18,"x performing delayed promotions (delayed ");
    poVar18 = (ostream *)std::ostream::operator<<(poVar18,this->delayed);
    poVar18 = std::operator<<(poVar18,", discarded ");
    poVar18 = (ostream *)std::ostream::operator<<(poVar18,(int)uVar20);
    poVar18 = std::operator<<(poVar18,", total ");
    poVar18 = (ostream *)
              std::ostream::operator<<
                        (poVar18,(int)uVar20 + (this->super_RRSolver).super_PPSolver.promotions);
    poVar18 = std::operator<<(poVar18,")");
    std::endl<char,std::char_traits<char>>(poVar18);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&P.super__Vector_base<int,_std::allocator<int>_>);
    return;
  }
  if ((this->super_RRSolver).super_PPSolver.super_Solver.trace != 0) {
    poVar18 = std::operator<<((this->super_RRSolver).super_PPSolver.super_Solver.logger,
                              "performing delayed promotions of player ");
    poVar18 = (ostream *)std::ostream::operator<<(poVar18,uVar23 & 1);
    std::endl<char,std::char_traits<char>>(poVar18);
  }
  local_5c = local_5c + 1;
  iVar19 = 0;
  while( true ) {
    local_40.g = (Game *)CONCAT44(local_40.g._4_4_,iVar19);
    lVar17 = (long)iVar19;
    if (((this->super_RRSolver).super_PPSolver.super_Solver.game)->n_vertices <= lVar17) break;
    piVar13 = (this->super_RRSolver).super_PPSolver.region;
    if (piVar13[lVar17] != 0xfffffffe) {
      piVar14 = this->region_;
      if (piVar14[lVar17] != -1) {
        if (((piVar13[lVar17] ^ uVar23) & 1) == 0) {
          piVar13[lVar17] = piVar14[lVar17];
          std::vector<int,_std::allocator<int>_>::push_back
                    ((this->super_RRSolver).super_PPSolver.regions + piVar13[iVar19],
                     (value_type_conflict3 *)&local_40);
          piVar14 = this->region_;
          lVar17 = (long)(int)local_40.g;
        }
        piVar14[lVar17] = -1;
        iVar19 = (int)local_40.g;
      }
    }
    iVar19 = iVar19 + 1;
  }
  if (P.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish !=
      P.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start) {
    P.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
         P.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
  }
  if ((this->super_RRSolver).super_PPSolver.super_Solver.trace != 0) {
    poVar18 = std::operator<<((this->super_RRSolver).super_PPSolver.super_Solver.logger,
                              "finished performing delayed promotions");
    std::endl<char,std::char_traits<char>>(poVar18);
  }
  iVar9 = (int)local_70;
  iVar6 = (int)local_78;
  local_70 = (int *)((ulong)local_70 & 0xffffffff00000000);
  local_78 = local_78 & 0xffffffff00000000;
  uVar1 = (this->super_RRSolver).super_PPSolver.inverse[uVar23];
  iVar19 = iVar6;
  if ((uVar23 & 1) == 0) {
    iVar19 = iVar9;
    iVar9 = iVar6;
  }
  piVar13 = &(this->super_RRSolver).super_PPSolver.promotions;
  *piVar13 = *piVar13 + iVar9;
  local_68 = (ulong)(uint)((int)local_68 + iVar19);
  goto LAB_0014c31e;
LAB_0014c0ed:
  if ((int)uVar23 < 0) goto LAB_0014c1bd;
  uVar1 = uVar23;
  if (((this->super_RRSolver).super_PPSolver.super_Solver.game)->_priority[uVar23] != p)
  goto LAB_0014c31e;
  uVar23 = uVar23 - 1;
  goto LAB_0014c0ed;
LAB_0014c1bd:
  uVar1 = 0xffffffff;
  goto LAB_0014c31e;
LAB_0014bf90:
  if (1 < (this->super_RRSolver).super_PPSolver.super_Solver.trace) {
    PPSolver::reportRegion((PPSolver *)this,(int)uVar20);
    uVar20 = (ulong)(uint)p;
  }
  res = (*(this->super_RRSolver).super_PPSolver.super_Solver._vptr_Solver[4])
                  (this,(ulong)uVar23,uVar20);
  if (res == 0xffffffff) {
    PPSolver::setDominion((PPSolver *)this,p);
    piVar13 = this->region_;
    uVar20 = ((this->super_RRSolver).super_PPSolver.super_Solver.game)->n_vertices;
    for (uVar26 = 0; (~((long)uVar20 >> 0x3f) & uVar20) != uVar26; uVar26 = uVar26 + 1) {
      piVar13[uVar26] = -1;
    }
    local_70 = (int *)((ulong)local_70 & 0xffffffff00000000);
    if (P.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish !=
        P.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start) {
      P.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
           P.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
    }
    local_78 = local_78 & 0xffffffff00000000;
    uVar1 = (int)uVar20 - 1;
    goto LAB_0014c31e;
  }
  puVar7 = (uint *)P.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_start;
  if (res == 0xfffffffe) {
    uVar10 = 0xffffffff;
    if ((int)uVar23 < -1) {
      uVar10 = uVar23;
    }
    for (; (uVar1 = uVar10, -1 < (int)uVar23 &&
           (uVar1 = uVar23,
           ((this->super_RRSolver).super_PPSolver.super_Solver.game)->_priority[uVar23] == p));
        uVar23 = uVar23 - 1) {
    }
    goto LAB_0014c31e;
  }
  do {
    puVar22 = puVar7;
    if (puVar22 ==
        (uint *)P.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_finish) goto LAB_0014bff2;
    puVar7 = puVar22 + 1;
  } while ((res <= (int)*puVar22) || (((*puVar22 ^ res) & 1) == 0));
  if (puVar22 ==
      (uint *)P.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_finish) {
LAB_0014bff2:
    uVar20 = ((this->super_RRSolver).super_PPSolver.super_Solver.game)->n_vertices;
    for (uVar26 = 0; (~((long)uVar20 >> 0x3f) & uVar20) != uVar26; uVar26 = uVar26 + 1) {
      if ((((((this->super_RRSolver).super_PPSolver.super_Solver.disabled)->_bits[uVar26 >> 6] >>
             (uVar26 & 0x3f) & 1) == 0) &&
          ((this->super_RRSolver).super_PPSolver.region[uVar26] < res)) &&
         (res <= this->region_[uVar26])) goto LAB_0014c10b;
    }
    if (puVar22 ==
        (uint *)P.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_finish) goto code_r0x0014c04e;
  }
LAB_0014c10b:
  iVar19 = (this->super_RRSolver).super_PPSolver.super_Solver.trace;
  if (iVar19 < 2) {
    if (iVar19 != 0) {
      poVar18 = std::operator<<((this->super_RRSolver).super_PPSolver.super_Solver.logger,
                                "\x1b[1;33mdelayed \x1b[36m");
      poVar18 = (ostream *)std::ostream::operator<<(poVar18,p);
      poVar18 = std::operator<<(poVar18," \x1b[37mto \x1b[36m");
      poVar18 = (ostream *)std::ostream::operator<<(poVar18,res);
      poVar18 = std::operator<<(poVar18,"\x1b[m");
      goto LAB_0014c215;
    }
  }
  else {
    poVar18 = std::operator<<((this->super_RRSolver).super_PPSolver.super_Solver.logger,
                              "\x1b[1;33mdelayed \x1b[36m");
    poVar18 = (ostream *)std::ostream::operator<<(poVar18,p);
    poVar18 = std::operator<<(poVar18," \x1b[37mto \x1b[36m");
    poVar18 = (ostream *)std::ostream::operator<<(poVar18,res);
    std::operator<<(poVar18,"\x1b[m:");
    pvVar3 = (this->super_RRSolver).super_PPSolver.regions;
    piVar4 = pvVar3[p].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_finish;
    for (piVar25 = pvVar3[p].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start; piVar25 != piVar4; piVar25 = piVar25 + 1) {
      iVar19 = *piVar25;
      poVar18 = std::operator<<((this->super_RRSolver).super_PPSolver.super_Solver.logger,
                                " \x1b[37m");
      local_40.g = (this->super_RRSolver).super_PPSolver.super_Solver.game;
      local_40.v = iVar19;
      poVar18 = operator<<(poVar18,&local_40);
      std::operator<<(poVar18,"\x1b[m");
    }
    poVar18 = (this->super_RRSolver).super_PPSolver.super_Solver.logger;
LAB_0014c215:
    std::endl<char,std::char_traits<char>>(poVar18);
  }
  this->delayed = this->delayed + 1;
  pvVar3 = (this->super_RRSolver).super_PPSolver.regions;
  piVar13 = this->region_;
  piVar15 = pvVar3[p].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish;
  for (piVar14 = pvVar3[p].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start; piVar14 != piVar15; piVar14 = piVar14 + 1) {
    piVar13[*piVar14] = res;
  }
  local_78 = CONCAT44(local_78._4_4_,(int)local_78 + (p & 1U ^ 1));
  local_70 = (int *)CONCAT44(local_70._4_4_,(int)local_70 + (p & 1U));
  uVar10 = 0xffffffff;
  if ((int)uVar23 < -1) {
    uVar10 = uVar23;
  }
  for (; (uVar1 = uVar10, -1 < (int)uVar23 &&
         (uVar1 = uVar23,
         ((this->super_RRSolver).super_PPSolver.super_Solver.game)->_priority[uVar23] == p));
      uVar23 = uVar23 - 1) {
  }
LAB_0014c31e:
  uVar23 = uVar1;
  pGVar24 = (this->super_RRSolver).super_PPSolver.super_Solver.game;
  goto LAB_0014bd93;
code_r0x0014c04e:
  PPSolver::promote((PPSolver *)this,p,res);
  __first = std::
            __remove_if<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                      ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                       P.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start,
                       (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                       P.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish,&p);
  std::vector<int,_std::allocator<int>_>::erase
            (&P,(const_iterator)__first._M_current,
             (const_iterator)
             P.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_finish);
  std::vector<int,_std::allocator<int>_>::push_back(&P,&res);
  piVar13 = (this->super_RRSolver).super_PPSolver.region;
  uVar20 = ((this->super_RRSolver).super_PPSolver.super_Solver.game)->n_vertices;
  piVar14 = this->region_;
  for (uVar26 = 0; (~((long)uVar20 >> 0x3f) & uVar20) != uVar26; uVar26 = uVar26 + 1) {
    if ((piVar13[uVar26] != 2) && (piVar14[uVar26] <= res)) {
      piVar14[uVar26] = -1;
    }
  }
  p = res;
  uVar20 = (ulong)res;
  uVar23 = (this->super_RRSolver).super_PPSolver.inverse[uVar20];
  goto LAB_0014bf90;
}

Assistant:

void
RRDPSolver::run()
{
    // obtain highest priority and allocate arrays
    max_prio = priority(nodecount()-1);
    regions = new std::vector<int>[max_prio+1];
    region = new int[nodecount()];
    region_ = new int[nodecount()];
    strategy = new int[nodecount()];
    inverse = new int[max_prio+1];

    // initialize arrays
    for (int i=0; i<nodecount(); i++) region[i] = disabled[i] ? -2 : priority(i);
    for (int i=0; i<nodecount(); i++) region_[i] = -1;
    for (int i=0; i<nodecount(); i++) strategy[i] = -1;

    // start loop at last node (highest priority)
    int i = nodecount() - 1;

    // reset statistics
    promotions = 0;
    int performances = 0;

    // set to track delayed promotions
    std::vector<int> P;
    int del0 = 0, del1 = 0, discarded = 0;

    /**
     * Two loops: the outer (normal) loop, and the inner (promotion-chain) loop.
     * The outer loop does region setup and attractor on the full region.
     * The inner loop only attracts from the promoted region.
     */

    while (true) {
        // get current priority and skip all disabled/attracted nodes
        int p = i < 0 ? -1 : priority(i);
        while (i >= 0 and priority(i) == p and (disabled[i] or region[i] > p)) i--;

        if (i < 0) {
            int max = -1;
            for (int i=0; i<nodecount(); i++) if (max < region_[i]) max = region_[i];
            if (max == -1) break; // done

            if (trace) logger << "performing delayed promotions of player " << (max&1) << std::endl;
            performances++;
            for (int i=0; i<nodecount(); i++) {
                if (region[i] == -2) continue;
                if (region_[i] != -1) {
                    if ((region[i]&1) == (max&1)) {
                        region[i] = region_[i];
                        regions[region[i]].push_back(i);
                    }
                    region_[i] = -1;
                }
            }
            P.clear();
            if (trace) logger << "finished performing delayed promotions" << std::endl;
            i = inverse[max];
            promotions += (max&1) ? del1 : del0;
            discarded += (max&1) ? del0 : del1;
            del0 = del1 = 0;
            continue;
        }

        // if empty, possibly reset and continue with next
        if (priority(i) != p) {
            if (!regions[p].empty()) resetRegion(p);
            continue;
        }

        inverse[p] = i;

        // RR-DP: only reset the region if:
        // - current node is promoted or attracted
        // - or region is empty
        // - or region does not fulfill conditions
        // This is checked by checkRegion()
        if (setupRegion(i, priority(i), !checkRegion(p))) {
            // region not empty, maybe promote
            while (true) {
                if (trace >= 2) reportRegion(p);
                int res = getRegionStatus(i, p);
                if (res == -2) {
                    // not closed, skip to next priority and break inner loop
                    while (i >= 0 and priority(i) == p) i--;
                    break;
                } else if (res == -1) {
                    // found dominion
                    setDominion(p);
                    // restart algorithm and break inner loop
                    i = nodecount() - 1;
                    // reset everything... (sadly)
                    // for (int j=0; j<nodecount(); j++) region[j] = disabled[j] ? -2 : priority(j);
                    // for (int j=0; j<nodecount(); j++) strategy[j] = -1;
                    for (int j=0; j<nodecount(); j++) region_[j] = -1;
                    P.clear();
                    del0 = del1 = 0;
                    break;
                } else {
                    // check if we are locked or not
                    bool locked = false;
                    for (auto l : P) {
                        if ((l&1) != (res&1) && l < res) {
                            locked = true;
                            break;
                        }
                    }
                    if (!locked) {
                        for (int i=0; i<nodecount(); i++) {
                            if (disabled[i]) continue;
                            if (region[i] < res && res <= region_[i]) {
                                // locked for reason b
                                locked = true;
                                break;
                            }
                        }
                    }
                    if (locked) {
                        // found delayed promotion
                        if (trace >= 2) {
                            logger << "\033[1;33mdelayed \033[36m" << p << " \033[37mto \033[36m" << res << "\033[m:";
                            for (int n : regions[p]) {
                                logger << " \033[37m" << label_vertex(n) << "\033[m";
                            }
                            logger << std::endl;
                        } else if (trace) {
                            logger << "\033[1;33mdelayed \033[36m" << p << " \033[37mto \033[36m" << res << "\033[m" << std::endl;
                        }
                        delayed++;
                        if (p&1) del1++;
                        else del0++;
                        // emulate delayed promotion in region_
                        for (int i : regions[p]) region_[i] = res;
                        // skip to next priority and break inner loop
                        while (i >= 0 and priority(i) == p) i--;
                        break;
                    } else {
                        // found promotion, perform it
                        promote(p, res);
                        // add promotion to P
                        P.erase(std::remove(P.begin(), P.end(), p), P.end());
                        P.push_back(res);
                        // remove from region_ below res
                        for (int i=0; i<nodecount(); i++) if (region[i] != 2 && region_[i] <= res) region_[i] = -1;
                        // continue loop with higher priority
                        i = inverse[res];
                        p = res;
                    }
                }
            }
        } else {
            // skip to next priority
            while (i >= 0 and priority(i) == p) i--;
        }
    }

    delete[] regions;
    delete[] region;
    delete[] region_;
    delete[] strategy;
    delete[] inverse;

    logger << "solved with " << promotions << " promotions, " << performances << "x performing delayed promotions (delayed " << delayed << ", discarded " << discarded << ", total " << promotions+discarded << ")" << std::endl;
}